

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

run_container_t * run_container_from_array(array_container_t *c)

{
  int iVar1;
  run_container_t *rc;
  array_container_t *in_RDI;
  uint16_t cur_val;
  int i;
  int32_t card;
  int run_start;
  int prev;
  run_container_t *answer;
  int32_t n_runs;
  int32_t in_stack_ffffffffffffffcc;
  uint uVar2;
  int local_30;
  uint local_28;
  uint local_24;
  
  array_container_number_of_runs(in_RDI);
  rc = run_container_create_given_capacity(in_stack_ffffffffffffffcc);
  local_24 = 0xfffffffe;
  local_28 = 0xffffffff;
  iVar1 = in_RDI->cardinality;
  if (iVar1 != 0) {
    for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
      uVar2 = (uint)in_RDI->array[local_30] << 0x10;
      if ((uint)in_RDI->array[local_30] != local_24 + 1) {
        if (local_28 != 0xffffffff) {
          add_run(rc,local_28,local_24);
        }
        local_28 = uVar2 >> 0x10;
      }
      local_24 = (uint)in_RDI->array[local_30];
    }
    add_run(rc,local_28,local_24);
  }
  return rc;
}

Assistant:

run_container_t *run_container_from_array(const array_container_t *c) {
    int32_t n_runs = array_container_number_of_runs(c);
    run_container_t *answer = run_container_create_given_capacity(n_runs);
    int prev = -2;
    int run_start = -1;
    int32_t card = c->cardinality;
    if (card == 0) return answer;
    for (int i = 0; i < card; ++i) {
        const uint16_t cur_val = c->array[i];
        if (cur_val != prev + 1) {
            // new run starts; flush old one, if any
            if (run_start != -1) add_run(answer, run_start, prev);
            run_start = cur_val;
        }
        prev = c->array[i];
    }
    // now prev is the last seen value
    add_run(answer, run_start, prev);
    // assert(run_container_cardinality(answer) == c->cardinality);
    return answer;
}